

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O2

void int_trp_abort(int line,char *file,char *format,...)

{
  long lVar1;
  char *file_00;
  char in_AL;
  bool bVar2;
  int iVar3;
  undefined8 in_RCX;
  char *pcVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t __maxlen;
  char *__s;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_138 [24];
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  string local_88;
  undefined8 local_68;
  va_list values;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  char *local_40;
  int local_38;
  allocator<char> local_31;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  __maxlen = 0x400;
  __s = local_138;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  local_40 = file;
  local_38 = line;
  do {
    pcVar4 = __s;
    lVar1 = -__maxlen;
    __s = pcVar4 + lVar1;
    values[0].overflow_arg_area = local_138;
    values[0]._0_8_ = &stack0x00000008;
    local_68 = 0x3000000018;
    __s[-8] = -0x23;
    __s[-7] = '\r';
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    iVar3 = vsnprintf(__s,__maxlen,format,&local_68);
    if (iVar3 < 0) {
      __maxlen = (size_t)((int)__maxlen + 0x400);
    }
    __s[-8] = -0xd;
    __s[-7] = '\r';
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    bVar2 = IsMsgSizeOk((uint32_t)__maxlen);
  } while ((iVar3 < 0) && (bVar2));
  builtin_strncpy(pcVar4 + lVar1 + -8,"\b\x0e\x11",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  trun::TestRunner::GetCurrentTestModule();
  builtin_strncpy(pcVar4 + lVar1 + -8,"\x1b\x0e\x11",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_31);
  iVar3 = local_38;
  file_00 = local_40;
  builtin_strncpy(pcVar4 + lVar1 + -8,"5\x0e\x11",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  trun::TestResponseProxy::Abort
            ((TestResponseProxy *)((long)values[0].reg_save_area + 0xa0),iVar3,file_00,&local_88);
  builtin_strncpy(pcVar4 + lVar1 + -8,">\x0e\x11",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::~string((string *)&local_88);
  builtin_strncpy(pcVar4 + lVar1 + -8,"G\x0e\x11",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  return;
}

Assistant:

static void int_trp_abort(int line, const char *file, const char *format, ...) {
    CREATE_REPORT_STRING()
    TestRunner::GetCurrentTestModule()->GetTestResponseProxy().Abort(line, file, std::string(newstr));
}